

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseDataObjectFrame(XFileParser *this,Node *pParent)

{
  bool bVar1;
  Node *pNVar2;
  Mesh *this_00;
  Logger *this_01;
  Node *node;
  Node *exroot;
  Mesh *mesh;
  string name;
  Node *local_a0;
  allocator local_91;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  readHeadOfDataObject(this,&local_50);
  pNVar2 = (Node *)operator_new(0x98);
  XFile::Node::Node(pNVar2,pParent);
  local_a0 = pNVar2;
  std::__cxx11::string::_M_assign((string *)pNVar2);
  if (pParent == (Node *)0x0) {
    pNVar2 = this->mScene->mRootNode;
    if (pNVar2 == (Node *)0x0) {
      this->mScene->mRootNode = local_a0;
    }
    else {
      bVar1 = std::operator!=(&pNVar2->mName,"$dummy_root");
      if (bVar1) {
        local_90._M_dataplus._M_p = (pointer)this->mScene->mRootNode;
        pNVar2 = (Node *)operator_new(0x98);
        XFile::Node::Node(pNVar2,(Node *)0x0);
        this->mScene->mRootNode = pNVar2;
        std::__cxx11::string::assign((char *)this->mScene->mRootNode);
        std::vector<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>::push_back
                  (&this->mScene->mRootNode->mChildren,(value_type *)&local_90);
        *(Node **)(local_90._M_dataplus._M_p + 0x60) = this->mScene->mRootNode;
      }
      std::vector<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>::push_back
                (&this->mScene->mRootNode->mChildren,&local_a0);
      local_a0->mParent = this->mScene->mRootNode;
    }
  }
  else {
    std::vector<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>::push_back
              (&pParent->mChildren,&local_a0);
  }
  while( true ) {
    GetNextToken_abi_cxx11_(&local_90,this);
    if (local_90._M_string_length == 0) {
      std::__cxx11::string::string
                ((string *)&local_70,"Unexpected end of file reached while parsing frame",&local_91)
      ;
      ThrowException(this,&local_70);
    }
    bVar1 = std::operator==(&local_90,"}");
    if (bVar1) break;
    bVar1 = std::operator==(&local_90,"Frame");
    if (bVar1) {
      ParseDataObjectFrame(this,local_a0);
    }
    else {
      bVar1 = std::operator==(&local_90,"FrameTransformMatrix");
      if (bVar1) {
        ParseDataObjectTransformationMatrix(this,&local_a0->mTrafoMatrix);
      }
      else {
        bVar1 = std::operator==(&local_90,"Mesh");
        if (bVar1) {
          this_00 = (Mesh *)operator_new(600);
          XFile::Mesh::Mesh(this_00,&local_50);
          local_70._M_dataplus._M_p = (pointer)this_00;
          std::vector<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>::push_back
                    (&local_a0->mMeshes,(value_type *)&local_70);
          ParseDataObjectMesh(this,(Mesh *)local_70._M_dataplus._M_p);
        }
        else {
          this_01 = DefaultLogger::get();
          Logger::warn(this_01,"Unknown data object in frame in x file");
          ParseUnknownDataObject(this);
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_90);
  }
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void XFileParser::ParseDataObjectFrame( Node* pParent)
{
    // A coordinate frame, or "frame of reference." The Frame template
    // is open and can contain any object. The Direct3D extensions (D3DX)
    // mesh-loading functions recognize Mesh, FrameTransformMatrix, and
    // Frame template instances as child objects when loading a Frame
    // instance.
    std::string name;
    readHeadOfDataObject(&name);

    // create a named node and place it at its parent, if given
    Node* node = new Node( pParent);
    node->mName = name;
    if( pParent)
    {
        pParent->mChildren.push_back( node);
    } else
    {
        // there might be multiple root nodes
        if( mScene->mRootNode != NULL)
        {
            // place a dummy root if not there
            if( mScene->mRootNode->mName != "$dummy_root")
            {
                Node* exroot = mScene->mRootNode;
                mScene->mRootNode = new Node( NULL);
                mScene->mRootNode->mName = "$dummy_root";
                mScene->mRootNode->mChildren.push_back( exroot);
                exroot->mParent = mScene->mRootNode;
            }
            // put the new node as its child instead
            mScene->mRootNode->mChildren.push_back( node);
            node->mParent = mScene->mRootNode;
        } else
        {
            // it's the first node imported. place it as root
            mScene->mRootNode = node;
        }
    }

    // Now inside a frame.
    // read tokens until closing brace is reached.
    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if (objectName.size() == 0)
            ThrowException( "Unexpected end of file reached while parsing frame");

        if( objectName == "}")
            break; // frame finished
        else
        if( objectName == "Frame")
            ParseDataObjectFrame( node); // child frame
        else
        if( objectName == "FrameTransformMatrix")
            ParseDataObjectTransformationMatrix( node->mTrafoMatrix);
        else
        if( objectName == "Mesh")
        {
            Mesh* mesh = new Mesh(name);
            node->mMeshes.push_back( mesh);
            ParseDataObjectMesh( mesh);
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in frame in x file");
            ParseUnknownDataObject();
        }
    }
}